

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

bool __thiscall ON_HistoryRecord::GetBoolValue(ON_HistoryRecord *this,int value_id,bool *b)

{
  ON_Value *pOVar1;
  bool bVar2;
  
  bVar2 = false;
  pOVar1 = FindValueHelper(this,value_id,1,false);
  if (pOVar1 != (ON_Value *)0x0) {
    if (*(int *)&pOVar1[2]._vptr_ON_Value == 1) {
      *b = (bool)**(undefined1 **)&pOVar1[1].m_value_id;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_HistoryRecord::GetBoolValue( int value_id, bool* b ) const
{
  bool rc = false;
  const ON_BoolValue* v = static_cast<ON_BoolValue*>(FindValueHelper(value_id,ON_Value::bool_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    *b = v->m_value[0];
    rc = true;
  }
  return rc;
}